

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

SyntaxKind slang::syntax::SyntaxFacts::getProceduralBlockKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,kind)) {
  case 0x5f:
    return AlwaysBlock;
  case 0x60:
    return AlwaysCombBlock;
  case 0x61:
    return AlwaysFFBlock;
  case 0x62:
    return AlwaysLatchBlock;
  }
  if (CONCAT22(in_register_0000003a,kind) == 0xc0) {
    return InitialBlock;
  }
  if (CONCAT22(in_register_0000003a,kind) != 0xa8) {
    return Unknown;
  }
  return FinalBlock;
}

Assistant:

SyntaxKind SyntaxFacts::getProceduralBlockKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::InitialKeyword: return SyntaxKind::InitialBlock;
        case TokenKind::FinalKeyword: return SyntaxKind::FinalBlock;
        case TokenKind::AlwaysKeyword: return SyntaxKind::AlwaysBlock;
        case TokenKind::AlwaysCombKeyword: return SyntaxKind::AlwaysCombBlock;
        case TokenKind::AlwaysFFKeyword: return SyntaxKind::AlwaysFFBlock;
        case TokenKind::AlwaysLatchKeyword: return SyntaxKind::AlwaysLatchBlock;
        default: return SyntaxKind::Unknown;
    }
}